

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cc
# Opt level: O0

uint8_t * SHA512_256(uint8_t *data,size_t len,uint8_t *out)

{
  undefined1 local_f8 [8];
  SHA512_CTX ctx;
  uint8_t *out_local;
  size_t len_local;
  uint8_t *data_local;
  
  ctx._208_8_ = out;
  BCM_sha512_256_init((SHA512_CTX *)local_f8);
  BCM_sha512_256_update((SHA512_CTX *)local_f8,data,len);
  BCM_sha512_256_final((uint8_t *)ctx._208_8_,(SHA512_CTX *)local_f8);
  OPENSSL_cleanse(local_f8,0xd8);
  return (uint8_t *)ctx._208_8_;
}

Assistant:

uint8_t *SHA512_256(const uint8_t *data, size_t len,
                uint8_t out[SHA512_256_DIGEST_LENGTH]) {
  SHA512_CTX ctx;
  BCM_sha512_256_init(&ctx);
  BCM_sha512_256_update(&ctx, data, len);
  BCM_sha512_256_final(out, &ctx);
  OPENSSL_cleanse(&ctx, sizeof(ctx));
  return out;
}